

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_user_agent.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::PragmaUserAgentInit(ClientContext *context,TableFunctionInitInput *input)

{
  DBConfig *this;
  pointer pPVar1;
  _Head_base<0UL,_duckdb::PragmaUserAgentData_*,_false> local_40;
  string local_38;
  
  local_40._M_head_impl = (PragmaUserAgentData *)operator_new(0x30);
  *(undefined ***)
   &(((element_type *)local_40._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
    __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__PragmaUserAgentData_01983e50;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)local_40._M_head_impl)->
          super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((long)&(((element_type *)local_40._M_head_impl)->db).internal + 8);
  (((element_type *)local_40._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  *(undefined1 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(((element_type *)local_40._M_head_impl)->db).internal + 8))->_M_pi = 0;
  *(undefined1 *)
   &(((element_type *)local_40._M_head_impl)->registered_state).
    super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
    ._M_t = 0;
  this = DBConfig::GetConfig((ClientContext *)input);
  DBConfig::UserAgent_abi_cxx11_(&local_38,this);
  pPVar1 = unique_ptr<duckdb::PragmaUserAgentData,_std::default_delete<duckdb::PragmaUserAgentData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaUserAgentData,_std::default_delete<duckdb::PragmaUserAgentData>,_true>
                         *)&local_40);
  ::std::__cxx11::string::_M_assign((string *)&pPVar1->user_agent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_40._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> PragmaUserAgentInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<PragmaUserAgentData>();
	auto &config = DBConfig::GetConfig(context);
	result->user_agent = config.UserAgent();

	return std::move(result);
}